

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_edge_uintwide_t_backend(void)

{
  type_conflict4 tVar1;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v_00;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v_01;
  int in_R8D;
  byte local_dd;
  int local_dc [2];
  undefined1 local_d4 [7];
  bool result_gcd_is_ok;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b4;
  undefined1 local_94 [8];
  type gcd_uv;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  v;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  u;
  uint i;
  local_small_uintwide_t_type gcd_max;
  bool result_is_ok;
  
  gcd_max.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6]._3_1_ = 1;
  u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<int>((number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&i,(int *)(u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems + 7),
                (type *)0x0);
  for (u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
      u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6] < 0x40;
      u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6] =
           u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6] + 1) {
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems + 6),
               (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    a = (number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)0x4d;
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(gcd_uv.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems + 6),
               (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    boost::multiprecision::operator-
              (&local_b4,
               (multiprecision *)
               (v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems + 6),v_00);
    boost::multiprecision::operator-
              ((number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_d4,
               (multiprecision *)
               (gcd_uv.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems + 6),v_01);
    boost::multiprecision::gcd<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>>
              ((type *)local_94,(multiprecision *)&local_b4,
               (number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_d4,a);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_94,
                       (number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&i);
    if (tVar1) {
      boost::multiprecision::
      number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&i,(number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_94);
    }
  }
  local_dc[0] = 0;
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&i,local_dc);
  local_dd = 0;
  if (tVar1) {
    local_dd = gcd_max.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6]._3_1_;
  }
  return (bool)(local_dd & 1);
}

Assistant:

auto test_edge_uintwide_t_backend() -> bool
{
  using local_small_uintwide_t_backend_type = boost::multiprecision::uintwide_t_backend<local_edge_cases::local_digits2_small>;

  using local_small_uintwide_t_type = boost::multiprecision::number<local_small_uintwide_t_backend_type, boost::multiprecision::et_off>;

  auto result_is_ok = true;

  {
    // This odd-looking code is intended to pick up some non-covered lines
    // in the Boost-intended uintwide_t_backend class.

    local_small_uintwide_t_type gcd_max { 0 };

    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(UINT32_C(64));
             ++i)
    {
      const auto u = generate_wide_integer_value<local_small_uintwide_t_type>();
      const auto v = generate_wide_integer_value<local_small_uintwide_t_type>();

      const auto gcd_uv = gcd(-u, -v);

      if(gcd_uv > gcd_max)
      {
        gcd_max = gcd_uv;
      }
    }

    const bool result_gcd_is_ok = (gcd_max > 0);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  return result_is_ok;
}